

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O1

size_t xmi_process_multi(PBuffer *buffer,MidiFile *midi)

{
  size_t sVar1;
  Stream *pSVar2;
  string name;
  PBuffer type;
  undefined1 auStack_88 [8];
  undefined1 local_80 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_68 [24];
  element_type *local_50 [2];
  undefined1 local_40 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  Buffer::pop((Buffer *)(local_40 + 0x10),
              (size_t)(buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,*(long *)(local_40._16_8_ + 0x18),
             *(long *)(local_40._16_8_ + 0x20) + *(long *)(local_40._16_8_ + 0x18));
  local_50[0] = (element_type *)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xmi2mid","");
  Log::Logger::operator[]((Logger *)auStack_88,(string *)&Log::Verbose);
  pSVar2 = Log::Stream::operator<<((Stream *)auStack_88,"\tchunk subtype: ");
  std::__ostream_insert<char,std::char_traits<char>>
            (pSVar2->stream,(char *)local_70._M_pi,local_68._0_8_);
  Log::Stream::~Stream((Stream *)auStack_88);
  if (local_50[0] != (element_type *)local_40) {
    operator_delete(local_50[0],(ulong)(local_40._0_8_ + 1));
  }
  Buffer::get_tail((Buffer *)local_80,
                   (size_t)(buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  xmi_process_chunks((PBuffer *)local_80,midi);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  sVar1 = ((buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->size;
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8)) {
    operator_delete(local_70._M_pi,local_68._8_8_ + 1);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return sVar1;
}

Assistant:

static size_t
xmi_process_multi(PBuffer buffer, MidiFile *midi) {
  PBuffer type = buffer->pop(4);
  std::string name = *type.get();
  Log::Verbose["xmi2mid"] << "\tchunk subtype: " << name;
  xmi_process_chunks(buffer->get_tail(4), midi);
  return buffer->get_size();
}